

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_test_cases.cpp
# Opt level: O0

void flat_forward_list_erase_test1(void)

{
  pointer_type *this;
  bool bVar1;
  size_type sVar2;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  local_90;
  undefined1 local_88 [16];
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  local_78;
  undefined1 local_70 [16];
  pointer_type local_60;
  size_t prev_elements_count;
  size_t elements_count;
  allocator_type local_40;
  undefined1 local_38 [8];
  pmr_flat_forward_list<FLAT_FORWARD_LIST_TEST> ffl;
  debug_memory_resource dbg_memory_resource;
  
  this = &ffl.buffer_.v2_.end;
  iffl::debug_memory_resource::debug_memory_resource((debug_memory_resource *)this);
  std::pmr::polymorphic_allocator<char>::polymorphic_allocator(&local_40,(memory_resource *)this);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::flat_forward_list((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                       *)local_38,local_40);
  fill_container_with_data<iffl::flat_forward_list<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,std::pmr::polymorphic_allocator<char>>>
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)local_38,10);
  sVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::size((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                  *)local_38);
  if (sVar2 < 10) {
    std::terminate();
  }
  local_60 = (pointer_type)
             iffl::
             flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
             ::size((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                     *)local_38);
  prev_elements_count = (size_t)local_60;
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::begin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)(local_70 + 8));
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::erase((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)local_70,(iterator *)local_38);
  prev_elements_count =
       iffl::
       flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
       ::size((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
               *)local_38);
  if ((pointer_type)prev_elements_count != local_60 + -1) {
    std::terminate();
  }
  local_60 = (pointer_type)prev_elements_count;
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::begin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)(local_88 + 8));
  iffl::
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  ::operator+(&local_78,(int)local_88 + 8);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::erase((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)local_88,(iterator *)local_38);
  prev_elements_count =
       iffl::
       flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
       ::size((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
               *)local_38);
  if ((pointer_type)prev_elements_count != local_60 + -1) {
    std::terminate();
  }
  local_60 = (pointer_type)prev_elements_count;
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::begin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)(local_a0 + 8));
  iffl::
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  ::operator+(&local_90,(int)local_a0 + 8);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::erase((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)local_a0,(iterator *)local_38);
  prev_elements_count =
       iffl::
       flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
       ::size((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
               *)local_38);
  if ((pointer_type)prev_elements_count == local_60 + -1) {
    local_60 = (pointer_type)prev_elements_count;
    iffl::
    flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
    ::last((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
            *)(local_b0 + 8));
    iffl::
    flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
    ::erase((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
             *)local_b0,(iterator *)local_38);
    prev_elements_count =
         iffl::
         flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
         ::size((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                 *)local_38);
    if ((pointer_type)prev_elements_count != local_60 + -1) {
      std::terminate();
    }
    local_60 = (pointer_type)prev_elements_count;
    iffl::
    flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
    ::begin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
             *)(local_c8 + 8));
    iffl::
    flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
    ::operator+(&local_b8,(int)local_c8 + 8);
    iffl::
    flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
    ::erase_all_from((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_c8,(iterator *)local_38);
    prev_elements_count =
         iffl::
         flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
         ::size((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                 *)local_38);
    if ((pointer_type)prev_elements_count == (pointer_type)0x1) {
      local_60 = (pointer_type)prev_elements_count;
      iffl::
      flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
      ::begin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
               *)(local_d8 + 8));
      iffl::
      flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
      ::erase_all_from((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                        *)local_d8,(iterator *)local_38);
      bVar1 = iffl::
              flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              ::empty((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                       *)local_38);
      if (!bVar1) {
        std::terminate();
      }
      iffl::
      flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
      ::~flat_forward_list
                ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                  *)local_38);
      iffl::debug_memory_resource::~debug_memory_resource
                ((debug_memory_resource *)&ffl.buffer_.v2_.end);
      return;
    }
    std::terminate();
  }
  std::terminate();
}

Assistant:

void flat_forward_list_erase_test1() {
    iffl::debug_memory_resource dbg_memory_resource;
    iffl::pmr_flat_forward_list<FLAT_FORWARD_LIST_TEST> ffl{ &dbg_memory_resource };
    fill_container_with_data(ffl, 10);

    FFL_CODDING_ERROR_IF_NOT(10 <= ffl.size());

    size_t elements_count = ffl.size();
    size_t prev_elements_count = elements_count;


    ffl.erase(ffl.begin());

    elements_count = ffl.size();
    FFL_CODDING_ERROR_IF_NOT(elements_count == prev_elements_count - 1);
    prev_elements_count = elements_count;


    ffl.erase(ffl.begin() + 1);

    elements_count = ffl.size();
    FFL_CODDING_ERROR_IF_NOT(elements_count == prev_elements_count - 1);
    prev_elements_count = elements_count;

    ffl.erase(ffl.begin() + 2);

    elements_count = ffl.size();
    FFL_CODDING_ERROR_IF_NOT(elements_count == prev_elements_count - 1);
    prev_elements_count = elements_count;

    ffl.erase(ffl.last());

    elements_count = ffl.size();
    FFL_CODDING_ERROR_IF_NOT(elements_count == prev_elements_count - 1);
    prev_elements_count = elements_count;

    ffl.erase_all_from(ffl.begin() + 1);

    elements_count = ffl.size();
    FFL_CODDING_ERROR_IF_NOT(elements_count == 1);
    prev_elements_count = elements_count;

    ffl.erase_all_from(ffl.begin());

    FFL_CODDING_ERROR_IF_NOT(ffl.empty());
}